

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

int Internal_FloatArrayCompare(size_t count,float *a,float *b)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  
  fVar1 = *a;
  fVar2 = *b;
  if (fVar2 <= fVar1) {
    if (fVar2 < fVar1) {
      return 1;
    }
    uVar3 = 0;
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      if (!NAN(fVar1)) goto LAB_0056ee3c;
      uVar3 = (uint)!NAN(fVar2);
    }
    if (1 < (long)count && (char)uVar3 == '\0') {
      pfVar4 = b + 1;
      pfVar5 = a + 2;
      do {
        fVar1 = pfVar5[-1];
        fVar2 = *pfVar4;
        if (fVar1 < fVar2) goto LAB_0056ee3c;
        if (fVar2 < fVar1) {
          return 1;
        }
        uVar3 = 0;
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          if (!NAN(fVar1)) goto LAB_0056ee3c;
          uVar3 = (uint)!NAN(fVar2);
        }
        if (uVar3 != 0) {
          return uVar3;
        }
        pfVar4 = pfVar4 + 1;
        bVar6 = pfVar5 < a + count;
        uVar3 = 0;
        pfVar5 = pfVar5 + 1;
      } while (bVar6);
    }
  }
  else {
LAB_0056ee3c:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

static int Internal_FloatArrayCompare(
  size_t count,
  const float* a,
  const float* b
  )
{
  const float* e = a + count;
  int rc = ON_CompareFloat(*a++, *b++);
  while( 0 == rc && a < e)
    rc = ON_CompareFloat(*a++, *b++);
  return rc;
}